

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase * AnalyzeClassPrototype(ExpressionContext *ctx,SynClassPrototype *syntax)

{
  TypeBase *pTVar1;
  uint nameHash;
  int iVar2;
  TypeBase *pTVar3;
  undefined4 extraout_var;
  TypeClass *this;
  undefined4 extraout_var_01;
  char *in_R8;
  InplaceStr IVar5;
  SynIdentifier local_80;
  TypeBase *pTVar4;
  undefined4 extraout_var_00;
  
  IVar5.end = in_R8;
  IVar5.begin = (syntax->name->name).end;
  anon_unknown.dwarf_c6b42::CheckTypeConflict
            ((anon_unknown_dwarf_c6b42 *)ctx,(ExpressionContext *)syntax,
             (SynBase *)(syntax->name->name).begin,IVar5);
  IVar5 = GetTypeNameInScope(ctx,ctx->scope,syntax->name->name);
  nameHash = NULLC::GetStringHash(IVar5.begin,IVar5.end);
  pTVar3 = anon_unknown.dwarf_c6b42::LookupTypeByName(ctx,nameHash);
  pTVar4 = pTVar3;
  if (pTVar3 != (TypeBase *)0x0) {
    if ((pTVar3->typeID != 0x18) || (*(char *)&pTVar3[3]._vptr_TypeBase == '\x01')) {
      anon_unknown.dwarf_c6b42::Stop
                (ctx,&syntax->super_SynBase,"ERROR: \'%.*s\' is being redefined",
                 (ulong)(uint)(*(int *)&(syntax->name->name).end - (int)(syntax->name->name).begin))
      ;
    }
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    pTVar4 = (TypeBase *)CONCAT44(extraout_var,iVar2);
    pTVar1 = ctx->typeVoid;
    pTVar4->typeID = 0x2b;
    (pTVar4->name).begin = (char *)syntax;
    (pTVar4->name).end = (char *)pTVar1;
    pTVar4->importModule = (ModuleData *)0x0;
    *(undefined1 *)&pTVar4->typeIndex = 0;
    pTVar4->_vptr_TypeBase = (_func_int **)&PTR__ExprBase_002491b8;
    pTVar4->size = (longlong)pTVar3;
  }
  if (pTVar3 == (TypeBase *)0x0) {
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x180);
    this = (TypeClass *)CONCAT44(extraout_var_00,iVar2);
    local_80.super_SynBase.begin = (syntax->name->super_SynBase).begin;
    local_80.super_SynBase.end = (syntax->name->super_SynBase).end;
    local_80.super_SynBase._vptr_SynBase = (_func_int **)&PTR__SynBase_002470e8;
    local_80.super_SynBase.typeID = 4;
    if (local_80.super_SynBase.begin == (Lexeme *)0x0) {
      local_80.super_SynBase.pos.begin = (char *)0x0;
    }
    else {
      local_80.super_SynBase.pos.begin = (local_80.super_SynBase.begin)->pos;
    }
    if (local_80.super_SynBase.end == (Lexeme *)0x0) {
      local_80.super_SynBase.pos.end = (char *)0x0;
    }
    else {
      local_80.super_SynBase.pos.end =
           (local_80.super_SynBase.end)->pos + (local_80.super_SynBase.end)->length;
    }
    if (local_80.super_SynBase.pos.end < local_80.super_SynBase.pos.begin) {
      __assert_fail("strEnd >= strBegin",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/StrAlgo.h"
                    ,0x28,"InplaceStr::InplaceStr(const char *, const char *)");
    }
    local_80.super_SynBase.next = (SynBase *)0x0;
    local_80.super_SynBase.listed = false;
    local_80.super_SynBase.isInternal = false;
    local_80.super_SynBase._vptr_SynBase = (_func_int **)&PTR__SynBase_002470a0;
    local_80.name = IVar5;
    TypeClass::TypeClass
              (this,ctx->allocator,&local_80,&syntax->super_SynBase,ctx->scope,
               (TypeGenericClassProto *)0x0,(IntrusiveList<MatchData>)ZEXT816(0),false,
               (TypeClass *)0x0);
    ExpressionContext::AddType(ctx,(TypeBase *)this);
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    pTVar4 = (TypeBase *)CONCAT44(extraout_var_01,iVar2);
    pTVar3 = ctx->typeVoid;
    pTVar4->typeID = 0x2b;
    (pTVar4->name).begin = (char *)syntax;
    (pTVar4->name).end = (char *)pTVar3;
    pTVar4->importModule = (ModuleData *)0x0;
    *(undefined1 *)&pTVar4->typeIndex = 0;
    pTVar4->_vptr_TypeBase = (_func_int **)&PTR__ExprBase_002491b8;
    pTVar4->size = (longlong)this;
  }
  return (ExprBase *)pTVar4;
}

Assistant:

ExprBase* AnalyzeClassPrototype(ExpressionContext &ctx, SynClassPrototype *syntax)
{
	CheckTypeConflict(ctx, syntax, syntax->name->name);

	InplaceStr typeName = GetTypeNameInScope(ctx, ctx.scope, syntax->name->name);

	if(TypeBase *type = LookupTypeByName(ctx, typeName.hash()))
	{
		TypeClass *originalDefinition = getType<TypeClass>(type);

		if(!originalDefinition || originalDefinition->completed)
			Stop(ctx, syntax, "ERROR: '%.*s' is being redefined", FMT_ISTR(syntax->name->name));

		return new (ctx.get<ExprClassPrototype>()) ExprClassPrototype(syntax, ctx.typeVoid, originalDefinition);
	}

	IntrusiveList<MatchData> actualGenerics;

	TypeClass *classType = new (ctx.get<TypeClass>()) TypeClass(ctx.allocator, SynIdentifier(syntax->name, typeName), syntax, ctx.scope, NULL, actualGenerics, false, NULL);

	ctx.AddType(classType);

	return new (ctx.get<ExprClassPrototype>()) ExprClassPrototype(syntax, ctx.typeVoid, classType);
}